

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

void __thiscall CFG::~CFG(CFG *this)

{
  _Base_ptr p_Var1;
  
  this->_vptr_CFG = (_func_int **)&PTR__CFG_00129968;
  for (p_Var1 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (*(long **)(p_Var1 + 1) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var1 + 1) + 8))();
    }
  }
  for (p_Var1 = (this->m_edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_edges)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (*(long **)(p_Var1 + 1) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var1 + 1) + 8))();
    }
  }
  std::
  _Rb_tree<CfgNode_*,_std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>,_std::_Select1st<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>,_std::less<CfgNode_*>,_std::allocator<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>_>
  ::~_Rb_tree(&(this->m_preds)._M_t);
  std::
  _Rb_tree<CfgNode_*,_std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>,_std::_Select1st<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>,_std::less<CfgNode_*>,_std::allocator<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>_>
  ::~_Rb_tree(&(this->m_succs)._M_t);
  std::
  _Rb_tree<CfgEdge_*,_CfgEdge_*,_std::_Identity<CfgEdge_*>,_std::less<CfgEdge_*>,_std::allocator<CfgEdge_*>_>
  ::~_Rb_tree(&(this->m_edges)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_CfgNode_*>,_std::_Select1st<std::pair<const_unsigned_long,_CfgNode_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgNode_*>_>_>
  ::~_Rb_tree(&(this->m_nodesMap)._M_t);
  std::
  _Rb_tree<CfgNode_*,_CfgNode_*,_std::_Identity<CfgNode_*>,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>
  ::~_Rb_tree(&(this->m_nodes)._M_t);
  std::__cxx11::string::~string((string *)&this->m_functionName);
  return;
}

Assistant:

CFG::~CFG() {
	for (CfgNode* node : m_nodes)
		delete node;

	for (CfgEdge* edge : m_edges)
		delete edge;
}